

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O1

SquareMatrix<double> __thiscall qclab::dense::eye<double>(dense *this,int64_t size)

{
  long lVar1;
  undefined8 *puVar2;
  __uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true> extraout_RDX;
  _Head_base<0UL,_double_*,_false> _Var3;
  SquareMatrix<double> SVar4;
  
  SquareMatrix<double>::SquareMatrix((SquareMatrix<double> *)this,size,0.0);
  _Var3._M_head_impl =
       (double *)
       extraout_RDX.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
       super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
       super__Head_base<0UL,_double_*,_false>._M_head_impl;
  if (0 < size) {
    lVar1 = *(long *)this;
    puVar2 = *(undefined8 **)(this + 8);
    _Var3._M_head_impl = (double *)0x0;
    do {
      *puVar2 = 0x3ff0000000000000;
      _Var3._M_head_impl = _Var3._M_head_impl + 1;
      puVar2 = puVar2 + lVar1 + 1;
    } while ((double *)size != _Var3._M_head_impl);
  }
  SVar4.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)_Var3._M_head_impl;
  SVar4.size_ = (size_type_conflict)this;
  return SVar4;
}

Assistant:

SquareMatrix< T > eye( const int64_t size ) {
      SquareMatrix< T > mat( size , T(0) ) ;
      #pragma omp parallel for
      for ( int64_t i = 0; i < size; i++ ) {
        mat(i,i) = T(1) ;
      }
      return mat ;
    }